

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O0

void __thiscall iDynTree::Visualizer::VisualizerPimpl::VisualizerPimpl(VisualizerPimpl *this)

{
  DummyModelVisualization *in_RDI;
  Model *this_00;
  
  this_00 = &in_RDI->m_dummyModel;
  DummyModelVisualization::DummyModelVisualization(in_RDI);
  DummyCamera::DummyCamera((DummyCamera *)this_00);
  DummyEnvironment::DummyEnvironment((DummyEnvironment *)in_RDI);
  DummyVectorsVisualization::DummyVectorsVisualization((DummyVectorsVisualization *)this_00);
  DummyFrameVisualization::DummyFrameVisualization((DummyFrameVisualization *)this_00);
  DummyTexturesHandler::DummyTexturesHandler((DummyTexturesHandler *)this_00);
  DummyShapeVisualization::DummyShapeVisualization((DummyShapeVisualization *)this_00);
  DummyLabel::DummyLabel((DummyLabel *)this_00);
  *(undefined1 *)&(in_RDI->super_IModelVisualization)._vptr_IModelVisualization = 0;
  *(undefined4 *)&in_RDI[1].m_dummyModel = 0xffffffff;
  return;
}

Assistant:

VisualizerPimpl()
    {
        m_isInitialized = false;
        lastFPS = -1;

#ifdef IDYNTREE_USES_IRRLICHT
        m_modelViz = std::make_shared<std::vector<ModelVisualization*>>();
        m_modelViz->resize(0);
        m_irrDevice  = 0;
        m_irrSmgr    = 0;
        m_irrDriver  = 0;
#endif
    }